

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O0

void __thiscall
RenX_LoggingPlugin::RenX_OnRefillCrate(RenX_LoggingPlugin *this,Server *server,PlayerInfo *player)

{
  bool bVar1;
  __sv_type _Var2;
  code *local_90;
  size_t local_70;
  char *local_68;
  undefined1 local_50 [8];
  string msg;
  logFuncType func;
  PlayerInfo *player_local;
  Server *server_local;
  RenX_LoggingPlugin *this_local;
  
  if ((*(ulong *)&this->field_0xa0 >> 0x2d & 1) == 0) {
    msg.field_2._8_8_ = RenX::Server::sendAdmChan;
  }
  else {
    msg.field_2._8_8_ = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)local_50,&this->refillCrateFmt);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  if (!bVar1) {
    RenX::processTags((string *)local_50,server,player,(PlayerInfo *)0x0,(BuildingInfo *)0x0);
    if ((msg.field_2._8_8_ & 1) == 0) {
      local_90 = (code *)msg.field_2._8_8_;
    }
    else {
      local_90 = *(code **)(*(long *)server + msg.field_2._8_8_ + -1);
    }
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
    local_70 = _Var2._M_len;
    local_68 = _Var2._M_str;
    (*local_90)(server,local_70,local_68);
  }
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnRefillCrate(RenX::Server &server, const RenX::PlayerInfo &player)
{
	logFuncType func;
	if (RenX_LoggingPlugin::refillCratePublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->refillCrateFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, &player);
		(server.*func)(msg);
	}
}